

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-recv-in-a-row.c
# Opt level: O1

void check_cb(uv_check_t *handle)

{
  int iVar1;
  undefined8 *extraout_RDX;
  int64_t eval_b;
  int64_t eval_a;
  
  if (handle == &check_handle) {
    if (recv_cnt == 6) {
      check_cb_called = 1;
      iVar1 = uv_check_stop(&check_handle);
      if (iVar1 == 0) {
        uv_close(&client,0);
        uv_close(&check_handle,0);
        uv_close(&server,0);
        return;
      }
      goto LAB_001e2f70;
    }
  }
  else {
    check_cb_cold_1();
  }
  check_cb_cold_2();
LAB_001e2f70:
  check_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 10;
  return;
}

Assistant:

static void check_cb(uv_check_t* handle) {
  ASSERT_PTR_EQ(&check_handle, handle);

  /**
   * sv_recv_cb() is called with nread set to zero to indicate
   * there is no more udp packet in the kernel, so the actual
   * recv_cnt is one larger than N.
   */
  ASSERT_EQ(N+1, recv_cnt);
  check_cb_called = 1;

  /* we are done */
  ASSERT_OK(uv_check_stop(handle));
  uv_close((uv_handle_t*) &client, NULL);
  uv_close((uv_handle_t*) &check_handle, NULL);
  uv_close((uv_handle_t*) &server, NULL);
}